

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tripep_closure.h
# Opt level: O2

void cross(double *p,double *q,double *s)

{
  *s = p[1] * q[2] - q[1] * p[2];
  s[1] = p[2] * *q - q[2] * *p;
  s[2] = *p * q[1] - *q * p[1];
  return;
}

Assistant:

void cross(double p[3], double q[3], double s[3])
 {
//!-----------------------------------------------------------------------
//  implicit none
//  real(dp), dimension(:), intent(in) :: p, q
//  real(dp), dimension(:), intent(out) :: s

//  s(1) = p(2)*q(3) - p(3)*q(2)
  s[0] = p[1]*q[2] - p[2]*q[1];
//  s(2) = p(3)*q(1) - p(1)*q(3)
  s[1] = p[2]*q[0] - p[0]*q[2];
//  s(3) = p(1)*q(2) - p(2)*q(1)
  s[2] = p[0]*q[1] - p[1]*q[0];

  return;
//end subroutine cross
 }